

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache_tests.cpp
# Opt level: O0

double __thiscall
cuckoocache_tests::HitRateTest::test_cache<CuckooCache::cache<uint256,SignatureCacheHasher>>
          (HitRateTest *this,size_t megabytes,double load)

{
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  ulong uVar4;
  reference puVar5;
  long in_RSI;
  vector<uint256,_std::allocator<uint256>_> *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double hit_rate;
  uint256 *h_1;
  vector<uint256,_std::allocator<uint256>_> *__range2_1;
  uint32_t count;
  uint256 *h;
  vector<uint256,_std::allocator<uint256>_> *__range2;
  uint8_t j;
  uint32_t *ptr;
  uint32_t i;
  uint32_t n_insert;
  size_t bytes;
  iterator __end2_1;
  iterator __begin2_1;
  iterator __end2;
  iterator __begin2;
  vector<uint256,_std::allocator<uint256>_> hashes_insert_copy;
  vector<uint256,_std::allocator<uint256>_> hashes;
  cache<uint256,_SignatureCacheHasher> set;
  cache<uint256,_SignatureCacheHasher> *in_stack_fffffffffffffe48;
  vector<uint256,_std::allocator<uint256>_> *in_stack_fffffffffffffe50;
  vector<uint256,_std::allocator<uint256>_> *in_stack_fffffffffffffe58;
  size_type in_stack_fffffffffffffe60;
  BasicTestingSetup *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  double dVar6;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  cache<uint256,_SignatureCacheHasher> *in_stack_fffffffffffffe80;
  vector<uint256,_std::allocator<uint256>_> *in_stack_fffffffffffffea0;
  cache<uint256,_SignatureCacheHasher> *in_stack_fffffffffffffeb0;
  uint local_144;
  byte local_129;
  cache<uint256,_SignatureCacheHasher> *local_128;
  uint local_120;
  array<unsigned_char,_32UL> in_stack_ffffffffffffff50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest
            (in_stack_fffffffffffffe68,(SeedRand)(in_stack_fffffffffffffe60 >> 0x20));
  std::vector<uint256,_std::allocator<uint256>_>::vector(&in_stack_fffffffffffffe48->table);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache
            ((cache<uint256,_SignatureCacheHasher> *)in_stack_fffffffffffffe68);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::setup_bytes
            ((cache<uint256,_SignatureCacheHasher> *)in_stack_fffffffffffffe68,
             in_stack_fffffffffffffe60);
  uVar4 = (ulong)((double)CONCAT44(in_XMM0_Db,in_XMM0_Da) * (double)((ulong)(in_RSI << 0x14) >> 5));
  std::vector<uint256,_std::allocator<uint256>_>::resize
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffe68,
             in_stack_fffffffffffffe60);
  for (local_120 = 0; local_120 < (uint)uVar4; local_120 = local_120 + 1) {
    std::vector<uint256,_std::allocator<uint256>_>::operator[]
              (in_stack_fffffffffffffe58,(size_type)in_stack_fffffffffffffe50);
    in_stack_fffffffffffffe80 =
         (cache<uint256,_SignatureCacheHasher> *)
         base_blob<256U>::begin((base_blob<256U> *)in_stack_fffffffffffffe48);
    local_128 = in_stack_fffffffffffffe80;
    for (local_129 = 0; local_129 < 8; local_129 = local_129 + 1) {
      uVar3 = RandomMixin<FastRandomContext>::rand32
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffe48);
      *(uint32_t *)
       &(local_128->table).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start = uVar3;
      local_128 = (cache<uint256,_SignatureCacheHasher> *)
                  ((long)&(local_128->table).super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_start + 4);
    }
  }
  std::vector<uint256,_std::allocator<uint256>_>::vector(in_stack_fffffffffffffea0,in_RDI);
  std::vector<uint256,_std::allocator<uint256>_>::begin(in_stack_fffffffffffffe50);
  std::vector<uint256,_std::allocator<uint256>_>::end(in_stack_fffffffffffffe50);
  while( true ) {
    bVar2 = __gnu_cxx::operator==<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                      ((__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                        *)in_stack_fffffffffffffe58,
                       (__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                        *)in_stack_fffffffffffffe50);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    puVar5 = __gnu_cxx::
             __normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>::
             operator*((__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                        *)in_stack_fffffffffffffe48);
    in_stack_fffffffffffffe48 =
         *(cache<uint256,_SignatureCacheHasher> **)(puVar5->super_base_blob<256U>).m_data._M_elems;
    in_stack_fffffffffffffe50 =
         *(vector<uint256,_std::allocator<uint256>_> **)
          ((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
    in_stack_fffffffffffffe58 =
         *(vector<uint256,_std::allocator<uint256>_> **)
          ((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
    CuckooCache::cache<uint256,_SignatureCacheHasher>::insert
              (in_stack_fffffffffffffeb0,(uint256)in_stack_ffffffffffffff50._M_elems);
    __gnu_cxx::__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>::
    operator++((__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_> *)
               in_stack_fffffffffffffe48);
  }
  local_144 = 0;
  std::vector<uint256,_std::allocator<uint256>_>::begin(in_stack_fffffffffffffe50);
  std::vector<uint256,_std::allocator<uint256>_>::end(in_stack_fffffffffffffe50);
  while( true ) {
    bVar2 = __gnu_cxx::operator==<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                      ((__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                        *)in_stack_fffffffffffffe58,
                       (__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                        *)in_stack_fffffffffffffe50);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>::
    operator*((__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_> *)
              in_stack_fffffffffffffe48);
    in_stack_fffffffffffffe7f =
         CuckooCache::cache<uint256,_SignatureCacheHasher>::contains
                   (in_stack_fffffffffffffe80,
                    (uint256 *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                    SUB81((ulong)in_stack_fffffffffffffe70 >> 0x38,0));
    local_144 = (byte)in_stack_fffffffffffffe7f + local_144;
    __gnu_cxx::__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>::
    operator++((__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_> *)
               in_stack_fffffffffffffe48);
  }
  dVar6 = (double)local_144 / (double)(uVar4 & 0xffffffff);
  std::vector<uint256,_std::allocator<uint256>_>::~vector(in_stack_fffffffffffffe58);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::~cache(in_stack_fffffffffffffe48);
  std::vector<uint256,_std::allocator<uint256>_>::~vector(in_stack_fffffffffffffe58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return dVar6;
  }
  __stack_chk_fail();
}

Assistant:

double test_cache(size_t megabytes, double load)
{
    SeedRandomForTest(SeedRand::ZEROS);
    std::vector<uint256> hashes;
    Cache set{};
    size_t bytes = megabytes * (1 << 20);
    set.setup_bytes(bytes);
    uint32_t n_insert = static_cast<uint32_t>(load * (bytes / sizeof(uint256)));
    hashes.resize(n_insert);
    for (uint32_t i = 0; i < n_insert; ++i) {
        uint32_t* ptr = (uint32_t*)hashes[i].begin();
        for (uint8_t j = 0; j < 8; ++j)
            *(ptr++) = m_rng.rand32();
    }
    /** We make a copy of the hashes because future optimizations of the
     * cuckoocache may overwrite the inserted element, so the test is
     * "future proofed".
     */
    std::vector<uint256> hashes_insert_copy = hashes;
    /** Do the insert */
    for (const uint256& h : hashes_insert_copy)
        set.insert(h);
    /** Count the hits */
    uint32_t count = 0;
    for (const uint256& h : hashes)
        count += set.contains(h, false);
    double hit_rate = ((double)count) / ((double)n_insert);
    return hit_rate;
}